

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON__CChangeTextureCoordinateHelper::DupVertex(ON__CChangeTextureCoordinateHelper *this,int vi)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_Mesh *pOVar4;
  uint *puVar5;
  ON_MeshFace *pOVar6;
  ON_3dPoint *pOVar7;
  ON_2fPoint *pOVar8;
  ON_3fVector *pOVar9;
  ON_Color *pOVar10;
  ON_2dPoint *pOVar11;
  ON_SurfaceCurvature *pOVar12;
  bool *pbVar13;
  ON_TextureCoordinates *pOVar14;
  ON_3fPoint *pOVar15;
  double dVar16;
  float fVar17;
  int iVar18;
  ON_3fPoint *pOVar19;
  long lVar20;
  ON_2fPoint *pOVar21;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar22;
  long lVar23;
  ON_3fPoint *pOVar24;
  ON_3fVector *pOVar25;
  ON_3dPoint *pOVar26;
  ON_2dPoint *pOVar27;
  ON_SurfaceCurvature *pOVar28;
  bool *pbVar29;
  int iVar30;
  ON_3fPoint *pOVar31;
  
  iVar18 = this->m_vuse_count;
  if (iVar18 == 0) {
    iVar18 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    this->m_vuse_count = iVar18;
    ON_SimpleArray<unsigned_int>::Reserve(&this->m_vuse,(long)iVar18);
    iVar18 = this->m_vuse_count;
    if ((-1 < iVar18) && (iVar18 <= (this->m_vuse).m_capacity)) {
      (this->m_vuse).m_count = iVar18;
    }
    ON_SimpleArray<unsigned_int>::Zero(&this->m_vuse);
    pOVar4 = this->m_mesh;
    puVar5 = (this->m_vuse).m_a;
    lVar20 = 0xc;
    for (lVar23 = 0; lVar23 < (pOVar4->m_F).m_count; lVar23 = lVar23 + 1) {
      pOVar6 = (pOVar4->m_F).m_a;
      uVar2 = *(uint *)((long)pOVar6->vi + lVar20 + -0xc);
      iVar18 = this->m_vuse_count;
      if ((int)uVar2 < iVar18 && -1 < (int)uVar2) {
        puVar5[uVar2] = puVar5[uVar2] + 1;
        iVar18 = this->m_vuse_count;
      }
      uVar2 = *(uint *)((long)pOVar6->vi + lVar20 + -8);
      if ((int)uVar2 < iVar18 && -1 < (int)uVar2) {
        puVar5[uVar2] = puVar5[uVar2] + 1;
        iVar18 = this->m_vuse_count;
      }
      iVar30 = *(int *)((long)pOVar6->vi + lVar20 + -4);
      if ((-1 < (long)iVar30) && (iVar30 < iVar18)) {
        puVar5[iVar30] = puVar5[iVar30] + 1;
        iVar30 = *(int *)((long)pOVar6->vi + lVar20 + -4);
        iVar18 = this->m_vuse_count;
      }
      iVar3 = *(int *)((long)pOVar6->vi + lVar20);
      if (((-1 < (long)iVar3) && (iVar30 != iVar3)) && (iVar3 < iVar18)) {
        puVar5[iVar3] = puVar5[iVar3] + 1;
      }
      lVar20 = lVar20 + 0x10;
    }
    iVar18 = this->m_vuse_count;
  }
  if ((-1 < vi) && (vi < iVar18)) {
    puVar5 = (this->m_vuse).m_a;
    uVar2 = puVar5[(uint)vi];
    if (uVar2 < 2) {
      return vi;
    }
    puVar5[(uint)vi] = uVar2 - 1;
  }
  ON_SimpleArray<ON_3fPoint>::AppendNew(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  pOVar31 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  lVar20 = (long)(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pOVar24 = (ON_3fPoint *)0x0;
  if (0 < lVar20) {
    pOVar24 = pOVar31 + lVar20 + -1;
  }
  pOVar24->z = pOVar31[vi].z;
  fVar17 = pOVar31[vi].y;
  pOVar24->x = pOVar31[vi].x;
  pOVar24->y = fVar17;
  if (&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint> != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::AppendNew(&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>);
    pOVar7 = (this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_a;
    lVar20 = (long)(this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>).m_count;
    pOVar26 = (ON_3dPoint *)0x0;
    if (0 < lVar20) {
      pOVar26 = pOVar7 + lVar20 + -1;
    }
    dVar16 = pOVar7[vi].y;
    pOVar26->x = pOVar7[vi].x;
    pOVar26->y = dVar16;
    pOVar26->z = pOVar7[vi].z;
  }
  if (this->m_bHasVertexTextures == true) {
    ON_SimpleArray<ON_2fPoint>::AppendNew(&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    pOVar8 = (this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    lVar20 = (long)(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
    pOVar21 = (ON_2fPoint *)0x0;
    if (0 < lVar20) {
      pOVar21 = pOVar8 + lVar20 + -1;
    }
    *pOVar21 = pOVar8[vi];
  }
  if (this->m_bHasVertexNormals == true) {
    ON_SimpleArray<ON_3fVector>::AppendNew(&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
    pOVar9 = (this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
    lVar20 = (long)(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
    pOVar25 = (ON_3fVector *)0x0;
    if (0 < lVar20) {
      pOVar25 = pOVar9 + lVar20 + -1;
    }
    fVar17 = pOVar9[vi].y;
    pOVar25->x = pOVar9[vi].x;
    pOVar25->y = fVar17;
    pOVar25->z = pOVar9[vi].z;
  }
  if (this->m_bHasVertexColors == true) {
    ON_SimpleArray<ON_Color>::AppendNew(&this->m_mesh->m_C);
    pOVar10 = (this->m_mesh->m_C).m_a;
    lVar20 = (long)(this->m_mesh->m_C).m_count;
    paVar22 = (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0;
    if (0 < lVar20) {
      paVar22 = &pOVar10[lVar20 + -1].field_0;
    }
    *paVar22 = pOVar10[vi].field_0;
  }
  if (this->m_bHasSurfaceParameters == true) {
    ON_SimpleArray<ON_2dPoint>::AppendNew(&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
    pOVar11 = (this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    lVar20 = (long)(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
    pOVar27 = (ON_2dPoint *)0x0;
    if (0 < lVar20) {
      pOVar27 = pOVar11 + lVar20 + -1;
    }
    pOVar11 = pOVar11 + vi;
    dVar16 = pOVar11->y;
    pOVar27->x = pOVar11->x;
    pOVar27->y = dVar16;
  }
  if (this->m_bHasPrincipalCurvatures == true) {
    ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(&this->m_mesh->m_K);
    pOVar12 = (this->m_mesh->m_K).m_a;
    lVar20 = (long)(this->m_mesh->m_K).m_count;
    pOVar28 = (ON_SurfaceCurvature *)0x0;
    if (0 < lVar20) {
      pOVar28 = pOVar12 + lVar20 + -1;
    }
    pOVar12 = pOVar12 + vi;
    dVar16 = pOVar12->k2;
    pOVar28->k1 = pOVar12->k1;
    pOVar28->k2 = dVar16;
  }
  if (this->m_bHasHiddenVertices == true) {
    ON_SimpleArray<bool>::AppendNew(&this->m_mesh->m_H);
    pOVar4 = this->m_mesh;
    pbVar13 = (pOVar4->m_H).m_a;
    bVar1 = pbVar13[vi];
    lVar20 = (long)(pOVar4->m_H).m_count;
    pbVar29 = (bool *)0x0;
    if (0 < lVar20) {
      pbVar29 = pbVar13 + lVar20 + -1;
    }
    *pbVar29 = bVar1;
    if (bVar1 == true) {
      pOVar4->m_hidden_count = pOVar4->m_hidden_count + 1;
    }
  }
  if (this->m_bHasCachedTextures == true) {
    uVar2 = (this->m_TC).m_count;
    pOVar31 = (ON_3fPoint *)(ulong)uVar2;
    if ((int)uVar2 < 1) {
      pOVar31 = (ON_3fPoint *)0x0;
    }
    for (pOVar24 = (ON_3fPoint *)0x0; pOVar31 != pOVar24;
        pOVar24 = (ON_3fPoint *)((long)&pOVar24->x + 1)) {
      pOVar14 = (this->m_TC).m_a[(long)pOVar24];
      ON_SimpleArray<ON_3fPoint>::AppendNew(&pOVar14->m_T);
      pOVar15 = (pOVar14->m_T).m_a;
      lVar20 = (long)(pOVar14->m_T).m_count;
      pOVar19 = pOVar15 + lVar20 + -1;
      if (lVar20 < 1) {
        pOVar19 = (ON_3fPoint *)0x0;
      }
      pOVar19->z = pOVar15[vi].z;
      fVar17 = pOVar15[vi].y;
      pOVar19->x = pOVar15[vi].x;
      pOVar19->y = fVar17;
    }
  }
  return (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count + -1;
}

Assistant:

int ON__CChangeTextureCoordinateHelper::DupVertex(int vi)
{
  if ( 0 == m_vuse_count )
  {
    // m_vuse[] is an array of length = original number of
    // vertices in m_mesh and m_vuse[vi] = number of faces
    // that reference vertex vi. If this vertex needs to be
    // split, vuse[vi] is decremented.  The ultimate goal
    // is to split a few times as needed so we don't
    // bloat the mesh with repeated calls to changing
    // texture maps. m_vuse[] is set the first time
    // DupVertex() is called.
    m_vuse_count = m_mesh.m_V.Count();
    m_vuse.Reserve(m_vuse_count);
    m_vuse.SetCount(m_vuse_count);
    m_vuse.Zero();
    for ( int fi = 0; fi < m_mesh.m_F.Count(); fi++ )
    {
      const int* Fvi = m_mesh.m_F[fi].vi;
      int i = Fvi[0];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[1];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[2];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[3];
      if ( Fvi[2] != i && i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
    }
  }

  if ( vi >= 0 && vi < m_vuse_count )
  {
    if ( m_vuse[vi] <= 1 )
      return vi; // only one face uses this vertex - no need to dup the vertex

    // otherwise we will duplicate this vertex, reducing its use count by 1.
    m_vuse[vi]--;
  }


  m_mesh.m_V.AppendNew();
  *m_mesh.m_V.Last() = m_mesh.m_V[vi];
  if ( 0 != m_mesh_dV )
  {
    m_mesh_dV->AppendNew();
    *(m_mesh_dV->Last()) = m_mesh_dV->operator[](vi);
  }
  if ( m_bHasVertexTextures )
  {
    m_mesh.m_T.AppendNew();
    *m_mesh.m_T.Last() = m_mesh.m_T[vi];
  }
  if ( m_bHasVertexNormals )
  {
    m_mesh.m_N.AppendNew();
    *m_mesh.m_N.Last() = m_mesh.m_N[vi];
  }
  if ( m_bHasVertexColors )
  {
    m_mesh.m_C.AppendNew();
    *m_mesh.m_C.Last() = m_mesh.m_C[vi];
  }
  if ( m_bHasSurfaceParameters )
  {
    m_mesh.m_S.AppendNew();
    *m_mesh.m_S.Last() = m_mesh.m_S[vi];
  }
  if ( m_bHasPrincipalCurvatures )
  {
    m_mesh.m_K.AppendNew();
    *m_mesh.m_K.Last() = m_mesh.m_K[vi];
  }
  if ( m_bHasHiddenVertices )
  {
    m_mesh.m_H.AppendNew();
    if ( 0 != (*m_mesh.m_H.Last() = m_mesh.m_H[vi]) )
      m_mesh.m_hidden_count++;
  }

  if ( m_bHasCachedTextures )
  {
    // Note:  This m_TC[] is the subset of m_mesh.m_TC[]
    //        that need to be duped.  The constructor
    //        insures that m_TC[i] is not nullptr and
    //        has the right count and capacity.
    //
    //        DO NOT REFERENCE m_mesh.m_TC[] in this block.
    int tccount = m_TC.Count();
    for ( int i = 0; i < tccount; i++ )
    {
      ON_SimpleArray<ON_3fPoint>& T = m_TC[i]->m_T;
      T.AppendNew();
      *T.Last() = T[vi];
    }
  }

  return m_mesh.m_V.Count()-1;
}